

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V2_AnnotationArrow::IsValid(ON_OBSOLETE_V2_AnnotationArrow *this,ON_TextLog *text_log)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_TextLog *text_log_local;
  ON_OBSOLETE_V2_AnnotationArrow *this_local;
  
  local_19 = true;
  bVar1 = ON_3dPoint::operator==(&this->m_tail,&this->m_head);
  if (bVar1) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_OBSOLETE_V2_AnnotationArrow has m_head=m_tail.\n");
    }
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ON_OBSOLETE_V2_AnnotationArrow::IsValid( ON_TextLog* text_log ) const
{
  bool rc = true;
  if (m_tail == m_head)
  {
    if ( 0 != text_log )
      text_log->Print("ON_OBSOLETE_V2_AnnotationArrow has m_head=m_tail.\n");
    rc = false;
  }
  return rc;
}